

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall mp::SPAdapter::ProcessCons(SPAdapter *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  SafeBool SVar4;
  int *piVar5;
  size_type sVar6;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar7;
  allocator_type *__a;
  long in_RDI;
  AlgebraicCon AVar8;
  int core_con_index;
  int stage_2;
  int i_3;
  int i_2;
  vector<int,_std::allocator<int>_> stage_offsets;
  int *stage_1;
  int i_1;
  iterator end;
  iterator i;
  int n;
  int stage;
  int core_var_index;
  int num_cons;
  vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
  *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar9;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  value_type vVar10;
  int in_stack_ffffffffffffff2c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  undefined1 *__n;
  SPAdapter *in_stack_ffffffffffffff40;
  int local_9c;
  int local_98;
  undefined1 local_81;
  vector<int,_std::allocator<int>_> local_80;
  int local_64;
  BasicProblem<mp::BasicProblemParams<int>_> *local_60;
  int local_58;
  BasicProblem<mp::BasicProblemParams<int>_> *local_50;
  int local_48;
  ExprBase local_40;
  int *local_38;
  int local_2c;
  RandomVarInfo *local_28;
  __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
  local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = BasicProblem<mp::BasicProblemParams<int>_>::num_algebraic_cons
                      ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1c7db4);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  if (local_c != 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x158),0);
    local_10 = *pvVar3;
    for (local_14 = 1; iVar2 = local_10, local_14 < *(int *)(in_RDI + 0x150);
        local_14 = local_14 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x158),(long)local_14);
      local_18 = iVar2 + *pvVar3;
      for (; local_10 < local_18; local_10 = local_10 + 1) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x120),(long)local_10);
        UpdateConStages(in_stack_ffffffffffffff40,(int)(in_stack_ffffffffffffff38 >> 0x20),
                        (int)in_stack_ffffffffffffff38);
      }
    }
    local_20._M_current =
         (RandomVarInfo *)
         std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
         begin(in_stack_ffffffffffffff18);
    local_28 = (RandomVarInfo *)
               std::
               vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
               end(in_stack_ffffffffffffff18);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (__normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
                               *)in_stack_ffffffffffffff18), bVar1) {
      __gnu_cxx::
      __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
      ::operator->(&local_20);
      UpdateConStages(in_stack_ffffffffffffff40,(int)(in_stack_ffffffffffffff38 >> 0x20),
                      (int)in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
      ::operator++(&local_20);
    }
    for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
      local_38 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a0),(long)local_2c);
      AVar8 = BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      local_60 = AVar8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                 .problem_;
      local_58 = AVar8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                 .index_;
      local_50 = local_60;
      local_48 = local_58;
      local_40.impl_ =
           (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                   BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   ::nonlinear_expr((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                                   );
      SVar4 = internal::ExprBase::operator_cast_to_function_pointer(&local_40);
      if (SVar4 != 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a0),(long)local_2c);
        local_64 = 1;
        piVar5 = std::max<int>(pvVar3,&local_64);
        *local_38 = *piVar5;
      }
      iVar2 = *local_38;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x170));
      if ((int)sVar6 <= iVar2) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x170),(long)*local_38);
      *pvVar3 = *pvVar3 + 1;
    }
    this_00 = (vector<int,_std::allocator<int>_> *)
              std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x170));
    pvVar7 = (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x158));
    if (pvVar7 < this_00) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x170));
      *(int *)(in_RDI + 0x150) = (int)sVar6;
      std::vector<int,_std::allocator<int>_>::resize(this_00,in_stack_ffffffffffffff38);
    }
    std::vector<int,_std::allocator<int>_>::resize(this_00,in_stack_ffffffffffffff38);
    __a = (allocator_type *)(long)*(int *)(in_RDI + 0x150);
    __n = &local_81;
    std::allocator<int>::allocator((allocator<int> *)0x1c8168);
    std::vector<int,_std::allocator<int>_>::vector(this_00,(size_type)__n,__a);
    std::allocator<int>::~allocator((allocator<int> *)0x1c8188);
    for (local_98 = 1; local_98 < *(int *)(in_RDI + 0x150); local_98 = local_98 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)(local_98 + -1));
      vVar10 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x170),
                          (long)(local_98 + -1));
      iVar2 = vVar10 + *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)local_98);
      *pvVar3 = iVar2;
    }
    for (local_9c = 0; local_9c < local_c; local_9c = local_9c + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a0),(long)local_9c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)*pvVar3);
      iVar2 = *pvVar3;
      *pvVar3 = iVar2 + 1;
      iVar9 = local_9c;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x188),(long)iVar2);
      *pvVar3 = iVar9;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a0),(long)local_9c);
      *pvVar3 = iVar2;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  }
  return;
}

Assistant:

void SPAdapter::ProcessCons() {
  int num_cons = problem_.num_algebraic_cons();
  num_stage_cons_.resize(num_stages_);
  if (num_cons == 0)
    return;
  // Compute stage of each constraint as a maximum of stages of variables
  // in it and temporarily store stages in con_orig2core_.
  con_orig2core_.resize(num_cons);
  int core_var_index = num_stage_vars_[0];
  for (int stage = 1; stage < num_stages_; ++stage) {
    for (int n = core_var_index + num_stage_vars_[stage];
         core_var_index < n; ++core_var_index) {
      UpdateConStages(var_core2orig_[core_var_index], stage);
    }
  }
  // Constraints containing random variables should be at least in the
  // second stage.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i)
    UpdateConStages(i->var_index, 1);
  for (int i = 0; i < num_cons; ++i) {
    int &stage = con_orig2core_[i];
    if (problem_.algebraic_con(i).nonlinear_expr())
      stage = std::max(con_orig2core_[i], 1);
    if (stage >= static_cast<int>(num_stage_cons_.size()))
      num_stage_cons_.resize(stage + 1);
    ++num_stage_cons_[stage];
  }
  if (num_stage_cons_.size() > num_stage_vars_.size()) {
    num_stages_ = (int)num_stage_cons_.size();
    num_stage_vars_.resize(num_stages_);
  }
  // Reorder constraints by stages.
  con_core2orig_.resize(num_cons);
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_cons_[i - 1];
  for (int i = 0; i < num_cons; ++i) {
    int stage = con_orig2core_[i];
    int core_con_index = stage_offsets[stage]++;
    con_core2orig_[core_con_index] = i;
    con_orig2core_[i] = core_con_index++;
  }
}